

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall Assimp::HMPImporter::ValidateHeader_HMP457(HMPImporter *this)

{
  uchar *puVar1;
  DeadlyImportError *pDVar2;
  allocator<char> local_39;
  string local_38;
  
  if ((this->super_MDLImporter).iFileSize < 0x78) {
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "HMP file is too small (header size is 120 bytes, this file is smaller)",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->super_MDLImporter).mBuffer;
  if ((*(float *)(puVar1 + 0x24) != 0.0) || (NAN(*(float *)(puVar1 + 0x24)))) {
    if ((*(float *)(puVar1 + 0x28) != 0.0) || (NAN(*(float *)(puVar1 + 0x28)))) {
      if ((1.0 <= *(float *)(puVar1 + 0x2c)) &&
         (1.0 <= (float)*(int *)(puVar1 + 0x3c) / *(float *)(puVar1 + 0x2c))) {
        if (*(int *)(puVar1 + 0x44) != 0) {
          return;
        }
        pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"There are no frames. At least one should be there",&local_39
                  );
        DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
        __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Number of triangles in either x or y direction is zero",
                 &local_39);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Size of triangles in either  x or y direction is zero",&local_39);
  DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
  __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HMPImporter::ValidateHeader_HMP457( )
{
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    if (120 > iFileSize)
    {
        throw DeadlyImportError("HMP file is too small (header size is "
            "120 bytes, this file is smaller)");
    }

    if (!pcHeader->ftrisize_x || !pcHeader->ftrisize_y)
        throw DeadlyImportError("Size of triangles in either  x or y direction is zero");

    if(pcHeader->fnumverts_x < 1.0f || (pcHeader->numverts/pcHeader->fnumverts_x) < 1.0f)
        throw DeadlyImportError("Number of triangles in either x or y direction is zero");

    if(!pcHeader->numframes)
        throw DeadlyImportError("There are no frames. At least one should be there");

}